

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O2

double get_rate_correction_factor(AV1_COMP *cpi,int width,int height)

{
  double *pdVar1;
  byte bVar2;
  int iVar3;
  AV1_PRIMARY *pAVar4;
  double *pdVar5;
  double *pdVar6;
  int iVar7;
  double *pdVar8;
  double *pdVar9;
  double dVar10;
  double dVar11;
  
  pAVar4 = cpi->ppi;
  bVar2 = cpi->gf_frame_index;
  iVar3 = (pAVar4->gf_group).frame_parallel_level[bVar2];
  pdVar1 = (cpi->rc).frame_level_rate_correction_factors;
  pdVar5 = (pAVar4->p_rc).rate_correction_factors;
  if (0 < iVar3) {
    pdVar5 = (cpi->rc).frame_level_rate_correction_factors;
  }
  pdVar8 = (pAVar4->p_rc).rate_correction_factors;
  pdVar9 = pdVar8;
  pdVar6 = (pAVar4->p_rc).rate_correction_factors;
  if (0 < iVar3) {
    pdVar9 = pdVar1;
    pdVar6 = (cpi->rc).frame_level_rate_correction_factors;
  }
  if ((cpi->common).current_frame.frame_type == '\0') {
    dVar10 = pdVar5[3];
  }
  else {
    dVar10 = pdVar6[2];
    dVar11 = *pdVar9;
    iVar7 = is_stat_consumption_stage(cpi);
    if (iVar7 == 0) {
      if (((((cpi->refresh_frame).alt_ref_frame == false) &&
           ((cpi->refresh_frame).golden_frame != true)) || ((cpi->rc).is_src_frame_alt_ref != 0)) ||
         ((pAVar4->use_svc != 0 ||
          (((cpi->oxcf).rc_cfg.mode == AOM_CBR && ((cpi->oxcf).rc_cfg.gf_cbr_boost_pct < 0x15))))))
      {
        dVar10 = dVar11;
      }
    }
    else {
      if (0 < iVar3) {
        pdVar8 = pdVar1;
      }
      dVar10 = pdVar8["\x03"[(pAVar4->gf_group).update_type[bVar2]]];
    }
  }
  dVar10 = ((double)((cpi->oxcf).frm_dim_cfg.height * (cpi->oxcf).frm_dim_cfg.width) /
           (double)(height * width)) * dVar10;
  dVar11 = 50.0;
  if (dVar10 <= 50.0) {
    dVar11 = dVar10;
  }
  return (double)(-(ulong)(dVar10 < 0.005) & 0x3f747ae147ae147b |
                 ~-(ulong)(dVar10 < 0.005) & (ulong)dVar11);
}

Assistant:

static double get_rate_correction_factor(const AV1_COMP *cpi, int width,
                                         int height) {
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const RefreshFrameInfo *const refresh_frame = &cpi->refresh_frame;
  double rcf;
  double rate_correction_factors_kfstd;
  double rate_correction_factors_gfarfstd;
  double rate_correction_factors_internormal;

  rate_correction_factors_kfstd =
      (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0)
          ? rc->frame_level_rate_correction_factors[KF_STD]
          : p_rc->rate_correction_factors[KF_STD];
  rate_correction_factors_gfarfstd =
      (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0)
          ? rc->frame_level_rate_correction_factors[GF_ARF_STD]
          : p_rc->rate_correction_factors[GF_ARF_STD];
  rate_correction_factors_internormal =
      (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0)
          ? rc->frame_level_rate_correction_factors[INTER_NORMAL]
          : p_rc->rate_correction_factors[INTER_NORMAL];

  if (cpi->common.current_frame.frame_type == KEY_FRAME) {
    rcf = rate_correction_factors_kfstd;
  } else if (is_stat_consumption_stage(cpi)) {
    const RATE_FACTOR_LEVEL rf_lvl =
        get_rate_factor_level(&cpi->ppi->gf_group, cpi->gf_frame_index);
    double rate_correction_factors_rflvl =
        (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0)
            ? rc->frame_level_rate_correction_factors[rf_lvl]
            : p_rc->rate_correction_factors[rf_lvl];
    rcf = rate_correction_factors_rflvl;
  } else {
    if ((refresh_frame->alt_ref_frame || refresh_frame->golden_frame) &&
        !rc->is_src_frame_alt_ref && !cpi->ppi->use_svc &&
        (cpi->oxcf.rc_cfg.mode != AOM_CBR ||
         cpi->oxcf.rc_cfg.gf_cbr_boost_pct > 20))
      rcf = rate_correction_factors_gfarfstd;
    else
      rcf = rate_correction_factors_internormal;
  }
  rcf *= resize_rate_factor(&cpi->oxcf.frm_dim_cfg, width, height);
  return fclamp(rcf, MIN_BPB_FACTOR, MAX_BPB_FACTOR);
}